

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.h
# Opt level: O3

DictionaryTypeHandlerBase<int> *
Js::DictionaryTypeHandlerBase<int>::NewTypeHandler<Js::DictionaryTypeHandlerBase<int>>
          (Recycler *recycler,int initialCapacity,uint16 inlineSlotCapacity,
          uint16 offsetOfInlineSlots)

{
  Recycler *alloc;
  DictionaryTypeHandlerBase<int> *this;
  undefined1 local_58 [8];
  TrackAllocData data;
  
  PropertyIndexRangesBase<Js::PropertyIndexRanges<int>_>::VerifySlotCapacity(initialCapacity);
  local_58 = (undefined1  [8])&typeinfo;
  data.typeinfo = (type_info *)0x0;
  data.plusSize = 0xffffffffffffffff;
  data.count = (size_t)anon_var_dwarf_99fbd0e;
  data.filename._0_4_ = 0x3a;
  alloc = Memory::Recycler::TrackAllocInfo(recycler,(TrackAllocData *)local_58);
  this = (DictionaryTypeHandlerBase<int> *)new<Memory::Recycler>(0x30,alloc,0x387914);
  DictionaryTypeHandlerBase(this,recycler,initialCapacity,inlineSlotCapacity,offsetOfInlineSlots);
  return this;
}

Assistant:

static SubClassType* NewTypeHandler(Recycler * recycler, int initialCapacity, uint16 inlineSlotCapacity, uint16 offsetOfInlineSlots)
        {
            PropertyIndexRangesType::VerifySlotCapacity(initialCapacity);
            return RecyclerNew(recycler, SubClassType, recycler, initialCapacity, inlineSlotCapacity, offsetOfInlineSlots);
        }